

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::updateScene(QGraphicsView *this,QList<QRectF> *rects)

{
  long lVar1;
  qreal qVar2;
  char cVar3;
  int iVar4;
  QRect *pQVar5;
  QRect *pQVar6;
  QWidget *pQVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  QRect *rect_1;
  qreal *pqVar11;
  QTransform *pQVar12;
  long lVar13;
  QRectF *rect;
  QRect *dirtyRect;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 uStack_e0;
  QRect local_d8;
  QRect local_c8;
  QRegion updateRegion;
  QArrayDataPointer<QRect> local_a8;
  QTransform transform;
  
  bVar17 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = *(long *)(this + 8);
  if (((*(byte *)(lVar13 + 0x301) & 0x10) == 0) && (*(int *)(lVar13 + 0x484) != 3)) {
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (QRect *)0x0;
    local_a8.size = 0;
    iVar4 = QRegion::rectCount();
    QList<QRect>::reserve((QList<QRect> *)&local_a8,(long)iVar4 + (rects->d).size);
    pQVar5 = (QRect *)QRegion::begin();
    pQVar6 = (QRect *)QRegion::end();
    for (; pQVar5 != pQVar6; pQVar5 = pQVar5 + 1) {
      QList<QRect>::emplaceBack<QRect_const&>((QList<QRect> *)&local_a8,pQVar5);
    }
    QRegion::QRegion((QRegion *)&transform);
    qVar2 = *(qreal *)(lVar13 + 0x528);
    *(qreal *)(lVar13 + 0x528) = transform.m_matrix[0][0];
    transform.m_matrix[0][0] = qVar2;
    QRegion::~QRegion((QRegion *)&transform);
    *(undefined8 *)(lVar13 + 0x530) = 0;
    *(undefined8 *)(lVar13 + 0x538) = 0xffffffffffffffff;
    bVar15 = (*(byte *)(lVar13 + 0x300) & 0x40) != 0;
    iVar4 = *(int *)(lVar13 + 0x484);
    if (iVar4 == 2) {
      bVar14 = 0x31 < (ulong)((rects->d).size + local_a8.size);
    }
    else {
      bVar14 = true;
      if (iVar4 != 4) {
        bVar14 = false;
      }
    }
    updateRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&updateRegion);
    local_c8.x1.m_i = 0;
    local_c8.y1.m_i = 0;
    local_c8.x2.m_i = -1;
    local_c8.y2.m_i = -1;
    pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    local_d8 = QWidget::rect(pQVar7);
    pqVar11 = (qreal *)&DAT_0067b698;
    pQVar12 = &transform;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar11;
      pqVar11 = pqVar11 + (ulong)bVar17 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar17 * -2 + 1) * 8);
    }
    viewportTransform(&transform,this);
    for (lVar10 = (rects->d).size << 5; lVar10 != 0; lVar10 = lVar10 + -0x20) {
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      QTransform::mapRect((QRectF *)local_108);
      auVar18 = QRectF::toAlignedRect();
      bVar16 = (*(byte *)(lVar13 + 0x488) & 2) == 0;
      uVar8 = (uint)bVar16;
      uVar9 = ~uVar8;
      local_e8._4_4_ = uVar9 + auVar18._4_4_;
      local_e8._0_4_ = uVar9 + auVar18._0_4_;
      uStack_e0._4_4_ = auVar18._12_4_ + uVar8 + 1;
      uStack_e0._0_4_ = (uint)bVar16 + auVar18._8_4_ + 1;
      cVar3 = QRect::intersects(&local_d8);
      if (cVar3 != '\0') {
        QList<QRect>::emplaceBack<QRect_const&>((QList<QRect> *)&local_a8,(QRect *)&local_e8);
      }
    }
    lVar13 = local_a8.size << 4;
    bVar16 = false;
    pQVar5 = local_a8.ptr;
    do {
      if (lVar13 == 0) {
        if (!bVar16) goto LAB_005be892;
        if (bVar15 && iVar4 != 0) {
          pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          if (bVar14) {
            QWidget::update(pQVar7,&local_c8);
          }
          else {
            QWidget::update(pQVar7,&updateRegion);
          }
          goto LAB_005be892;
        }
        break;
      }
      if (bVar14) {
        QRect::operator|=(&local_c8,pQVar5);
      }
      else {
        QRegion::operator+=(&updateRegion,pQVar5);
      }
      pQVar5 = pQVar5 + 1;
      lVar13 = lVar13 + -0x10;
      bVar16 = true;
    } while (bVar15 && iVar4 != 0);
    pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::update(pQVar7);
LAB_005be892:
    QRegion::~QRegion(&updateRegion);
    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::updateScene(const QList<QRectF> &rects)
{
    // ### Note: Since 4.5, this slot is only called if the user explicitly
    // establishes a connection between the scene and the view, as the scene
    // and view are no longer connected. We need to keep it working (basically
    // leave it as it is), but the new delivery path is through
    // QGraphicsScenePrivate::itemUpdate().
    Q_D(QGraphicsView);
    if (d->fullUpdatePending || d->viewportUpdateMode == QGraphicsView::NoViewportUpdate)
        return;

    // Extract and reset dirty scene rect info.
    QList<QRect> dirtyViewportRects;
    dirtyViewportRects.reserve(d->dirtyRegion.rectCount() + rects.size());
    for (const QRect &dirtyRect : d->dirtyRegion)
        dirtyViewportRects += dirtyRect;
    d->dirtyRegion = QRegion();
    d->dirtyBoundingRect = QRect();

    bool fullUpdate = !d->accelerateScrolling || d->viewportUpdateMode == QGraphicsView::FullViewportUpdate;
    bool boundingRectUpdate = (d->viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate)
                              || (d->viewportUpdateMode == QGraphicsView::SmartViewportUpdate
                                  && ((dirtyViewportRects.size() + rects.size()) >= QGRAPHICSVIEW_REGION_RECT_THRESHOLD));

    QRegion updateRegion;
    QRect boundingRect;
    QRect viewportRect = viewport()->rect();
    bool redraw = false;
    QTransform transform = viewportTransform();

    // Convert scene rects to viewport rects.
    for (const QRectF &rect : rects) {
        QRect xrect = transform.mapRect(rect).toAlignedRect();
        if (!(d->optimizationFlags & DontAdjustForAntialiasing))
            xrect.adjust(-2, -2, 2, 2);
        else
            xrect.adjust(-1, -1, 1, 1);
        if (!viewportRect.intersects(xrect))
            continue;
        dirtyViewportRects << xrect;
    }

    for (const QRect &rect : std::as_const(dirtyViewportRects)) {
        // Add the exposed rect to the update region. In rect update
        // mode, we only count the bounding rect of items.
        if (!boundingRectUpdate) {
            updateRegion += rect;
        } else {
            boundingRect |= rect;
        }
        redraw = true;
        if (fullUpdate) {
            // If fullUpdate is true and we found a visible dirty rect,
            // we're done.
            break;
        }
    }

    if (!redraw)
        return;

    if (fullUpdate)
        viewport()->update();
    else if (boundingRectUpdate)
        viewport()->update(boundingRect);
    else
        viewport()->update(updateRegion);
}